

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::DemangleRustSymbolEncoding
               (char *mangled,char *out,size_t out_size)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ReturnAddress RVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  byte bVar12;
  char *pcVar13;
  bool bVar14;
  int ignored_de_bruijn_index;
  RustSymbolParser RStack_1e8;
  int local_34;
  
  memset(&RStack_1e8,0,0x194);
  RStack_1e8.encoding_ = mangled;
  RStack_1e8.out_ = out;
  RStack_1e8.out_end_ = out + out_size;
  if (out_size != 0) {
    *out = '\0';
  }
  if ((*mangled == '_') && (mangled[1] == 'R')) {
    RStack_1e8.pos_ = 2;
    lVar4 = (long)RStack_1e8.recursion_depth_;
    iVar11 = 0;
    bVar12 = 0;
    if (lVar4 != 0x100) {
      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
      RStack_1e8.recursion_stack_[lVar4] = kInstantiatingCrate;
switchD_0026875a_caseD_43:
      do {
        lVar4 = (long)RStack_1e8.pos_ + 1;
        iVar8 = (int)lVar4;
        bVar1 = RStack_1e8.encoding_[RStack_1e8.pos_];
        bVar12 = 0;
        if (bVar1 < 0x4d) {
          if (bVar1 == 0x42) {
            RStack_1e8.pos_ = iVar8;
            bVar3 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e8);
            if (!bVar3) goto LAB_00269963;
            if (RStack_1e8.silence_depth_ != 0) goto switchD_00268e58_caseD_1c;
            if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
            uVar9 = RStack_1e8.recursion_depth_ + 1;
            RVar7 = kPathBackrefEnding;
          }
          else {
            if (bVar1 == 0x43) {
              bVar12 = 0;
              RStack_1e8.pos_ = iVar8;
              bVar3 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&RStack_1e8,'\0');
              if (bVar3) goto LAB_00268e17;
              break;
            }
            if (bVar1 != 0x49) break;
            if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
            uVar9 = RStack_1e8.recursion_depth_ + 1;
            RVar7 = kBeginGenericArgList;
            RStack_1e8.pos_ = iVar8;
          }
        }
        else {
          bVar12 = 0;
          if (0x57 < bVar1) {
            if (bVar1 != 0x58) {
              if (bVar1 != 0x59) break;
              if (RStack_1e8.silence_depth_ < 1) {
                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 2)
                goto LAB_00269963;
                RStack_1e8.out_[0] = '<';
                RStack_1e8.out_[1] = '\0';
                RStack_1e8.out_ = RStack_1e8.out_ + 1;
              }
              lVar4 = (long)RStack_1e8.recursion_depth_;
              if (lVar4 != 0x100) {
                RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                RStack_1e8.pos_ = iVar8;
                RStack_1e8.recursion_stack_[lVar4] = kTraitDefinitionInfix;
                iVar8 = RStack_1e8.pos_;
LAB_002686aa:
                do {
                  RStack_1e8.pos_ = iVar8;
                  lVar4 = (long)RStack_1e8.pos_;
                  if ((byte)(RStack_1e8.encoding_[lVar4] + 0x9fU) < 0x1a) {
                    RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                    bVar3 = false;
                    pcVar13 = "i8";
                    switch(RStack_1e8.encoding_[lVar4]) {
                    case 'a':
                      break;
                    case 'b':
                      bVar3 = false;
                      pcVar13 = "bool";
                      break;
                    case 'c':
                      bVar3 = false;
                      pcVar13 = "char";
                      break;
                    case 'd':
                      bVar3 = false;
                      pcVar13 = "f64";
                      break;
                    case 'e':
                      bVar3 = false;
                      pcVar13 = "str";
                      break;
                    case 'f':
                      bVar3 = false;
                      pcVar13 = "f32";
                      break;
                    default:
                      bVar3 = true;
                      pcVar13 = (char *)0x0;
                      break;
                    case 'h':
                      bVar3 = false;
                      pcVar13 = "u8";
                      break;
                    case 'i':
                      bVar3 = false;
                      pcVar13 = "isize";
                      break;
                    case 'j':
                      bVar3 = false;
                      pcVar13 = "usize";
                      break;
                    case 'l':
                      bVar3 = false;
                      pcVar13 = "i32";
                      break;
                    case 'm':
                      bVar3 = false;
                      pcVar13 = "u32";
                      break;
                    case 'n':
                      bVar3 = false;
                      pcVar13 = "i128";
                      break;
                    case 'o':
                      bVar3 = false;
                      pcVar13 = "u128";
                      break;
                    case 'p':
                      bVar3 = false;
                      pcVar13 = "_";
                      break;
                    case 's':
                      bVar3 = false;
                      pcVar13 = "i16";
                      break;
                    case 't':
                      bVar3 = false;
                      pcVar13 = "u16";
                      break;
                    case 'u':
                      bVar3 = false;
                      pcVar13 = "()";
                      break;
                    case 'v':
                      bVar3 = false;
                      pcVar13 = "...";
                      break;
                    case 'x':
                      bVar3 = false;
                      pcVar13 = "i64";
                      break;
                    case 'y':
                      bVar3 = false;
                      pcVar13 = "u64";
                      break;
                    case 'z':
                      bVar3 = false;
                      pcVar13 = "!";
                    }
                    if (!bVar3) {
                      if (0 < RStack_1e8.silence_depth_) goto LAB_00268e17;
                      sVar5 = strlen(pcVar13);
                      if (sVar5 + 1 <= (ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_)) {
                        memcpy(RStack_1e8.out_,pcVar13,sVar5 + 1);
                        RStack_1e8.out_ = RStack_1e8.out_ + sVar5;
                        goto LAB_00268e17;
                      }
                    }
                    break;
                  }
                  if (RStack_1e8.encoding_[lVar4] != 'A') {
                    switch(RStack_1e8.encoding_[RStack_1e8.pos_]) {
                    case 'B':
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      bVar3 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e8);
                      if (!bVar3) goto LAB_00269963;
                      if (RStack_1e8.silence_depth_ != 0) {
switchD_00268e58_caseD_1c:
                        lVar4 = (long)RStack_1e8.position_depth_;
                        RStack_1e8.position_depth_ = RStack_1e8.position_depth_ + -1;
                        RStack_1e8.pos_ = RStack_1e8.position_stack_[lVar4 + -1];
LAB_00268e17:
                        bVar12 = 0;
                        uVar9 = RStack_1e8.recursion_depth_;
                        if (iVar11 < 0x1ffff) {
LAB_00268e2e:
                          do {
                            pcVar13 = RStack_1e8.out_;
                            iVar8 = RStack_1e8.silence_depth_;
                            bVar12 = 0;
                            if ((int)uVar9 < 1) break;
                            iVar11 = iVar11 + 1;
                            RStack_1e8.recursion_depth_ = uVar9 - 1;
                            switch(RStack_1e8.recursion_stack_[(uint)RStack_1e8.recursion_depth_]) {
                            case kInstantiatingCrate:
                              if (0x19 < (byte)((RStack_1e8.encoding_[RStack_1e8.pos_] & 0xdfU) +
                                               0xbf)) goto switchD_00268e58_caseD_1;
                              RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                              RVar7 = kVendorSpecificSuffix;
                              if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
                              goto LAB_00268b8d;
                            case kVendorSpecificSuffix:
switchD_00268e58_caseD_1:
                              if (0x2e < (byte)RStack_1e8.encoding_[RStack_1e8.pos_])
                              goto LAB_00269963;
                              bVar12 = (byte)(0x401000000001 >>
                                             (RStack_1e8.encoding_[RStack_1e8.pos_] & 0x3fU));
                              goto LAB_00269966;
                            case kIdentifierInUppercaseNamespace:
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 3)
                                goto LAB_00269963;
                                RStack_1e8.out_[2] = '\0';
                                RStack_1e8.out_[0] = ':';
                                RStack_1e8.out_[1] = ':';
                                RStack_1e8.out_ = RStack_1e8.out_ + 2;
                              }
                              lVar4 = (long)RStack_1e8.namespace_depth_;
                              RStack_1e8.namespace_depth_ = RStack_1e8.namespace_depth_ + -1;
                              bVar3 = anon_unknown_0::RustSymbolParser::ParseIdentifier
                                                (&RStack_1e8,RStack_1e8.namespace_stack_[lVar4 + -1]
                                                );
                              goto LAB_0026952d;
                            case kIdentifierInLowercaseNamespace:
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 3)
                                goto LAB_00269963;
                                RStack_1e8.out_[2] = '\0';
                                RStack_1e8.out_[0] = ':';
                                RStack_1e8.out_[1] = ':';
                                RStack_1e8.out_ = RStack_1e8.out_ + 2;
                              }
                              bVar3 = anon_unknown_0::RustSymbolParser::ParseIdentifier
                                                (&RStack_1e8,'\0');
                              goto LAB_0026952d;
                            case kInherentImplType:
                              if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
                              uVar6 = (ulong)(uint)RStack_1e8.recursion_depth_;
                              RStack_1e8.recursion_depth_ = uVar9;
                              RStack_1e8.recursion_stack_[uVar6] = kInherentImplEnding;
                              iVar8 = RStack_1e8.pos_;
                              goto LAB_002686aa;
                            case kInherentImplEnding:
                            case kTraitImplEnding:
                            case kTraitDefinitionEnding:
                              bVar3 = true;
                              if ((0 < RStack_1e8.silence_depth_) ||
                                 (bVar14 = (ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_
                                                  ) < 2, bVar3 = !bVar14, bVar14))
                              goto LAB_0026952d;
                              RStack_1e8.out_[0] = '>';
                              RStack_1e8.out_[1] = '\0';
                              goto LAB_00269520;
                            case kTraitImplType:
                              if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
                              uVar6 = (ulong)(uint)RStack_1e8.recursion_depth_;
                              RStack_1e8.recursion_depth_ = uVar9;
                              RStack_1e8.recursion_stack_[uVar6] = kTraitImplInfix;
                              iVar8 = RStack_1e8.pos_;
                              goto LAB_002686aa;
                            case kTraitImplInfix:
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 5)
                                goto LAB_00269963;
                                builtin_strncpy(RStack_1e8.out_," as ",5);
                                RStack_1e8.out_ = RStack_1e8.out_ + 4;
                              }
                              if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
                              RVar7 = kTraitImplEnding;
                              goto LAB_00268b8d;
                            case kImplPathEnding:
                            case kFinishFn:
                              goto switchD_00268e58_caseD_9;
                            case kTraitDefinitionInfix:
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 5)
                                goto LAB_00269963;
                                builtin_strncpy(RStack_1e8.out_," as ",5);
                                RStack_1e8.out_ = RStack_1e8.out_ + 4;
                              }
                              if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
                              RVar7 = kTraitDefinitionEnding;
                              goto LAB_00268b8d;
                            case kArraySize:
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 3)
                                goto LAB_00269963;
                                RStack_1e8.out_[2] = '\0';
                                RStack_1e8.out_[0] = ';';
                                RStack_1e8.out_[1] = ' ';
                                RStack_1e8.out_ = RStack_1e8.out_ + 2;
                              }
                              lVar4 = (long)RStack_1e8.recursion_depth_;
                              if (lVar4 != 0x100) {
                                RStack_1e8.recursion_depth_ = uVar9;
                                RStack_1e8.recursion_stack_[lVar4] = kFinishArray;
                                goto LAB_00269457;
                              }
                              goto LAB_00269963;
                            case kFinishArray:
                            case kSliceEnding:
                              bVar3 = true;
                              if ((RStack_1e8.silence_depth_ < 1) &&
                                 (bVar3 = 1 < (ulong)((long)RStack_1e8.out_end_ -
                                                     (long)RStack_1e8.out_), bVar3)) {
                                RStack_1e8.out_[0] = ']';
                                RStack_1e8.out_[1] = '\0';
                                goto LAB_00269520;
                              }
                              goto LAB_0026952d;
                            case kAfterFirstTupleElement:
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') {
                                RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                                bVar3 = true;
                                if ((0 < RStack_1e8.silence_depth_) ||
                                   (bVar14 = (ulong)((long)RStack_1e8.out_end_ -
                                                    (long)RStack_1e8.out_) < 3, bVar3 = !bVar14,
                                   bVar14)) goto LAB_0026952d;
                                RStack_1e8.out_[2] = '\0';
                                RStack_1e8.out_[0] = ',';
                                RStack_1e8.out_[1] = ')';
                                RStack_1e8.out_ = RStack_1e8.out_ + 2;
                                goto LAB_00269528;
                              }
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 3)
                                goto LAB_00269963;
                                RStack_1e8.out_[2] = '\0';
                                RStack_1e8.out_[0] = ',';
                                RStack_1e8.out_[1] = ' ';
                                RStack_1e8.out_ = RStack_1e8.out_ + 2;
                              }
                              lVar4 = (long)RStack_1e8.recursion_depth_;
                              if (lVar4 == 0x100) goto LAB_00269963;
                              RStack_1e8.recursion_depth_ = uVar9;
                              RStack_1e8.recursion_stack_[lVar4] = kAfterSecondTupleElement;
                              iVar8 = RStack_1e8.pos_;
                              goto LAB_002686aa;
                            case kAfterSecondTupleElement:
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') goto LAB_002692d5;
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 3)
                                goto LAB_00269963;
                                RStack_1e8.out_[2] = '\0';
                                RStack_1e8.out_[0] = ',';
                                RStack_1e8.out_[1] = ' ';
                                RStack_1e8.out_ = RStack_1e8.out_ + 2;
                              }
                              lVar4 = (long)RStack_1e8.recursion_depth_;
                              if (lVar4 == 0x100) goto LAB_00269963;
                              RStack_1e8.recursion_depth_ = uVar9;
                              RStack_1e8.recursion_stack_[lVar4] = kAfterThirdTupleElement;
                              iVar8 = RStack_1e8.pos_;
                              goto LAB_002686aa;
                            case kAfterThirdTupleElement:
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] != 'E') {
                                if (RStack_1e8.silence_depth_ < 1) {
                                  if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 7
                                     ) goto LAB_00269963;
                                  builtin_strncpy(RStack_1e8.out_,", ...)",7);
                                  RStack_1e8.out_ = RStack_1e8.out_ + 6;
                                }
                                RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                                goto switchD_00268e58_caseD_12;
                              }
LAB_002692d5:
                              RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                              bVar3 = true;
                              if ((RStack_1e8.silence_depth_ < 1) &&
                                 (bVar3 = 1 < (ulong)((long)RStack_1e8.out_end_ -
                                                     (long)RStack_1e8.out_), bVar3)) {
                                RStack_1e8.out_[0] = ')';
                                RStack_1e8.out_[1] = '\0';
LAB_00269520:
                                RStack_1e8.out_ = RStack_1e8.out_ + 1;
LAB_00269528:
                                bVar3 = true;
                              }
LAB_0026952d:
                              bVar12 = 0;
                              if ((bVar3 == false) ||
                                 (uVar9 = RStack_1e8.recursion_depth_, iVar11 == 0x1ffff))
                              goto LAB_00269966;
                              goto LAB_00268e2e;
                            case kAfterSubsequentTupleElement:
switchD_00268e58_caseD_12:
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') goto LAB_00269376;
                              lVar4 = (long)RStack_1e8.recursion_depth_;
                              if (lVar4 == 0x100) goto LAB_00269963;
                              RStack_1e8.recursion_depth_ = uVar9;
                              RStack_1e8.recursion_stack_[lVar4] = kAfterSubsequentTupleElement;
                              iVar8 = RStack_1e8.pos_;
                              goto LAB_002686aa;
                            case kContinueParameterList:
                              goto switchD_00268e58_caseD_13;
                            case kBeginAutoTraits:
                            case kContinueAutoTraits:
                              goto switchD_00268e58_caseD_15;
                            case kContinueDynTrait:
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'p') {
                                if (RStack_1e8.silence_depth_ < 1) {
                                  if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 3
                                     ) goto LAB_00269963;
                                  RStack_1e8.out_[2] = '\0';
                                  RStack_1e8.out_[0] = '<';
                                  RStack_1e8.out_[1] = '>';
                                  RStack_1e8.out_ = RStack_1e8.out_ + 2;
                                }
                                RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                                goto switchD_00268e58_caseD_18;
                              }
                              break;
                            case kContinueAssocBinding:
switchD_00268e58_caseD_18:
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'p') {
                                RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                                bVar12 = 0;
                                bVar3 = anon_unknown_0::RustSymbolParser::
                                        ParseUndisambiguatedIdentifier(&RStack_1e8,'\0',0);
                                if (!bVar3) goto LAB_00269966;
                                lVar4 = (long)RStack_1e8.recursion_depth_;
                                if (lVar4 == 0x100) goto LAB_00269963;
                                RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                                RStack_1e8.recursion_stack_[lVar4] = kContinueAssocBinding;
                                iVar8 = RStack_1e8.pos_;
                                goto LAB_002686aa;
                              }
switchD_00268e58_caseD_9:
                              RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + -1;
                              break;
                            case kConstData:
                              RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + -1;
                              if ((RStack_1e8.encoding_[RStack_1e8.pos_] == 'n') &&
                                 (RStack_1e8.pos_ = RStack_1e8.pos_ + 1, iVar8 < 2)) {
                                if ((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_ < 2)
                                goto LAB_00269963;
                                RStack_1e8.out_ = RStack_1e8.out_ + 1;
                                *pcVar13 = '-';
                                *RStack_1e8.out_ = '\0';
                              }
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 3)
                                goto LAB_00269963;
                                RStack_1e8.out_[2] = '\0';
                                RStack_1e8.out_[0] = '0';
                                RStack_1e8.out_[1] = 'x';
                                RStack_1e8.out_ = RStack_1e8.out_ + 2;
                              }
                              pcVar13 = RStack_1e8.out_;
                              lVar4 = (long)RStack_1e8.pos_;
                              cVar2 = RStack_1e8.encoding_[lVar4];
                              if (cVar2 == '0') {
                                RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                                if (RStack_1e8.silence_depth_ < 1) {
                                  if ((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_ < 2)
                                  goto LAB_00269963;
                                  RStack_1e8.out_ = RStack_1e8.out_ + 1;
                                  *pcVar13 = '0';
                                  *RStack_1e8.out_ = '\0';
                                }
                                cVar2 = RStack_1e8.encoding_[RStack_1e8.pos_];
                              }
                              else if ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0x9fU) < 6) {
                                do {
                                  pcVar13 = RStack_1e8.out_;
                                  RStack_1e8.pos_ = (int)lVar4 + 1;
                                  if (RStack_1e8.silence_depth_ < 1) {
                                    if ((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_ < 2)
                                    goto LAB_00269963;
                                    RStack_1e8.out_ = RStack_1e8.out_ + 1;
                                    *pcVar13 = RStack_1e8.encoding_[lVar4];
                                    *RStack_1e8.out_ = '\0';
                                  }
                                  lVar4 = (long)RStack_1e8.pos_;
                                  cVar2 = RStack_1e8.encoding_[lVar4];
                                } while ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0x9fU) < 6);
                              }
                              if (cVar2 != '_') goto LAB_00269963;
                              RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                              break;
                            case kBeginGenericArgList:
                              if (RStack_1e8.silence_depth_ < 1) {
                                if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 5)
                                goto LAB_00269963;
                                builtin_strncpy(RStack_1e8.out_,"::<>",5);
                                RStack_1e8.out_ = RStack_1e8.out_ + 4;
                              }
                              RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                              goto switchD_00268e58_caseD_1b;
                            case kContinueGenericArgList:
switchD_00268e58_caseD_1b:
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') {
LAB_00269376:
                                RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                                goto switchD_00268e58_caseD_9;
                              }
                              lVar4 = (long)RStack_1e8.recursion_depth_;
                              if (lVar4 == 0x100) goto LAB_00269963;
                              RStack_1e8.recursion_depth_ = uVar9;
                              RStack_1e8.recursion_stack_[lVar4] = kContinueGenericArgList;
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] != 'K') {
                                iVar8 = RStack_1e8.pos_;
                                if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'L') {
                                  RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                                  bVar3 = anon_unknown_0::RustSymbolParser::ParseBase62Number
                                                    (&RStack_1e8,&local_34);
                                  goto LAB_0026952d;
                                }
                                goto LAB_002686aa;
                              }
                              RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
LAB_00269457:
                              while (RStack_1e8.encoding_[RStack_1e8.pos_] == 'B') {
                                RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                                bVar3 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e8);
                                if (!bVar3) goto LAB_00269963;
                                if (RStack_1e8.silence_depth_ != 0) goto switchD_00268e58_caseD_1e;
                                lVar4 = (long)RStack_1e8.recursion_depth_;
                                if (lVar4 == 0x100) goto LAB_00269963;
                                RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                                RStack_1e8.recursion_stack_[lVar4] = kConstantBackrefEnding;
                              }
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'p') {
                                RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                                bVar3 = true;
                                if ((0 < RStack_1e8.silence_depth_) ||
                                   (bVar14 = (ulong)((long)RStack_1e8.out_end_ -
                                                    (long)RStack_1e8.out_) < 2, bVar3 = !bVar14,
                                   bVar14)) goto LAB_0026952d;
                                RStack_1e8.out_[0] = '_';
                                RStack_1e8.out_[1] = '\0';
                                goto LAB_00269520;
                              }
                              RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                              lVar4 = (long)RStack_1e8.recursion_depth_;
                              if (lVar4 == 0x100) goto LAB_00269963;
                              RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                              RStack_1e8.recursion_stack_[lVar4] = kConstData;
                              iVar8 = RStack_1e8.pos_;
                              goto LAB_002686aa;
                            case kPathBackrefEnding:
                            case kTypeBackrefEnding:
                              goto switchD_00268e58_caseD_1c;
                            case kConstantBackrefEnding:
switchD_00268e58_caseD_1e:
                              lVar4 = (long)RStack_1e8.position_depth_;
                              RStack_1e8.position_depth_ = RStack_1e8.position_depth_ + -1;
                              RStack_1e8.pos_ = RStack_1e8.position_stack_[lVar4 + -1];
                            }
                            uVar9 = RStack_1e8.recursion_depth_;
                            if (iVar11 == 0x1ffff) goto LAB_00269963;
                          } while( true );
                        }
                        goto LAB_00269966;
                      }
                      lVar4 = (long)RStack_1e8.recursion_depth_;
                      if (lVar4 == 0x100) goto LAB_00269963;
                      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                      RStack_1e8.recursion_stack_[lVar4] = kTypeBackrefEnding;
                      iVar8 = RStack_1e8.pos_;
                      goto LAB_002686aa;
                    default:
                      goto switchD_0026875a_caseD_43;
                    case 'D':
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 5)
                        goto LAB_00269963;
                        builtin_strncpy(RStack_1e8.out_,"dyn ",5);
                        RStack_1e8.out_ = RStack_1e8.out_ + 4;
                      }
                      bVar3 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder(&RStack_1e8);
                      if (!bVar3) goto LAB_00269963;
                      if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') goto LAB_0026956b;
                      RVar7 = kBeginAutoTraits;
LAB_00269798:
                      if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
                      lVar4 = (long)RStack_1e8.recursion_depth_;
                      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                      RStack_1e8.recursion_stack_[lVar4] = RVar7;
                      if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
                      uVar9 = RStack_1e8.recursion_depth_ + 1;
                      RVar7 = kContinueDynTrait;
                      goto LAB_00268b8d;
                    case 'F':
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 6)
                        goto LAB_00269963;
                        builtin_strncpy(RStack_1e8.out_,"fn...",6);
                        RStack_1e8.out_ = RStack_1e8.out_ + 5;
                      }
                      RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                      bVar3 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder(&RStack_1e8);
                      if (!bVar3) goto LAB_00269963;
                      if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'U') {
                        RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      }
                      if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'K') {
                        if (RStack_1e8.encoding_[(long)RStack_1e8.pos_ + 1] == 'C') {
                          RStack_1e8.pos_ = RStack_1e8.pos_ + 2;
                        }
                        else {
                          bVar12 = 0;
                          RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                          bVar3 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                            (&RStack_1e8,'\0',0);
                          if (!bVar3) goto LAB_00269966;
                        }
                      }
switchD_00268e58_caseD_13:
                      if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') {
                        RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                        lVar4 = (long)RStack_1e8.recursion_depth_;
                        if (lVar4 == 0x100) goto LAB_00269963;
                        RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                        RStack_1e8.recursion_stack_[lVar4] = kFinishFn;
                        iVar8 = RStack_1e8.pos_;
                      }
                      else {
                        lVar4 = (long)RStack_1e8.recursion_depth_;
                        if (lVar4 == 0x100) goto LAB_00269963;
                        RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                        RStack_1e8.recursion_stack_[lVar4] = kContinueParameterList;
                        iVar8 = RStack_1e8.pos_;
                      }
                      goto LAB_002686aa;
                    case 'O':
                      iVar8 = RStack_1e8.pos_ + 1;
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 6)
                        goto LAB_00269963;
                        builtin_strncpy(RStack_1e8.out_,"*mut ",6);
                        RStack_1e8.out_ = RStack_1e8.out_ + 5;
                      }
                      goto LAB_002686aa;
                    case 'P':
                      iVar8 = RStack_1e8.pos_ + 1;
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 8)
                        goto LAB_00269963;
                        builtin_strncpy(RStack_1e8.out_,"*const ",8);
                        RStack_1e8.out_ = RStack_1e8.out_ + 7;
                      }
                      goto LAB_002686aa;
                    case 'Q':
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 6)
                        goto LAB_00269963;
                        builtin_strncpy(RStack_1e8.out_,"&mut ",6);
                        RStack_1e8.out_ = RStack_1e8.out_ + 5;
                      }
                      bVar3 = anon_unknown_0::RustSymbolParser::ParseOptionalLifetime(&RStack_1e8);
                      break;
                    case 'R':
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 2)
                        goto LAB_00269963;
                        RStack_1e8.out_[0] = '&';
                        RStack_1e8.out_[1] = '\0';
                        RStack_1e8.out_ = RStack_1e8.out_ + 1;
                      }
                      iVar8 = RStack_1e8.pos_ + 1;
                      if (RStack_1e8.encoding_[RStack_1e8.pos_ + 1] != 'L') goto LAB_002686aa;
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 2;
                      bVar3 = anon_unknown_0::RustSymbolParser::ParseBase62Number
                                        (&RStack_1e8,&local_34);
                      break;
                    case 'S':
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 2)
                        goto LAB_00269963;
                        RStack_1e8.out_[0] = '[';
                        RStack_1e8.out_[1] = '\0';
                        RStack_1e8.out_ = RStack_1e8.out_ + 1;
                      }
                      lVar4 = (long)RStack_1e8.recursion_depth_;
                      if (lVar4 == 0x100) goto LAB_00269963;
                      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                      RStack_1e8.recursion_stack_[lVar4] = kSliceEnding;
                      iVar8 = RStack_1e8.pos_;
                      goto LAB_002686aa;
                    case 'T':
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 2)
                        goto LAB_00269963;
                        RStack_1e8.out_[0] = '(';
                        RStack_1e8.out_[1] = '\0';
                        RStack_1e8.out_ = RStack_1e8.out_ + 1;
                      }
                      if (RStack_1e8.encoding_[RStack_1e8.pos_ + 1] == 'E') {
                        RStack_1e8.pos_ = RStack_1e8.pos_ + 2;
                        if (0 < RStack_1e8.silence_depth_) goto LAB_00268e17;
                        if (1 < (ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_)) {
                          RStack_1e8.out_[0] = ')';
                          RStack_1e8.out_[1] = '\0';
                          RStack_1e8.out_ = RStack_1e8.out_ + 1;
                          goto LAB_00268e17;
                        }
                        goto LAB_00269963;
                      }
                      lVar4 = (long)RStack_1e8.recursion_depth_;
                      if (lVar4 == 0x100) goto LAB_00269963;
                      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      RStack_1e8.recursion_stack_[lVar4] = kAfterFirstTupleElement;
                      iVar8 = RStack_1e8.pos_;
                      goto LAB_002686aa;
                    }
                    iVar8 = RStack_1e8.pos_;
                    if (bVar3 == false) break;
                    goto LAB_002686aa;
                  }
                  RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                  if (RStack_1e8.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 2) break;
                    RStack_1e8.out_[0] = '[';
                    RStack_1e8.out_[1] = '\0';
                    RStack_1e8.out_ = RStack_1e8.out_ + 1;
                  }
                  lVar4 = (long)RStack_1e8.recursion_depth_;
                  if (lVar4 == 0x100) break;
                  RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                  RStack_1e8.recursion_stack_[lVar4] = kArraySize;
                  iVar8 = RStack_1e8.pos_;
                } while( true );
              }
              goto LAB_00269963;
            }
            if (RStack_1e8.silence_depth_ < 1) {
              if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 2) goto LAB_00269963;
              RStack_1e8.out_[0] = '<';
              RStack_1e8.out_[1] = '\0';
              RStack_1e8.out_ = RStack_1e8.out_ + 1;
            }
            RVar7 = kTraitImplType;
            goto LAB_00268a63;
          }
          if (bVar1 == 0x4d) {
            if (RStack_1e8.silence_depth_ < 1) {
              if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 2) goto LAB_00269963;
              RStack_1e8.out_[0] = '<';
              RStack_1e8.out_[1] = '\0';
              RStack_1e8.out_ = RStack_1e8.out_ + 1;
            }
            RVar7 = kInherentImplType;
LAB_00268a63:
            if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
            lVar4 = (long)RStack_1e8.recursion_depth_;
            RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
            RStack_1e8.pos_ = iVar8;
            RStack_1e8.recursion_stack_[lVar4] = RVar7;
            RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
            bVar3 = anon_unknown_0::RustSymbolParser::ParseDisambiguator(&RStack_1e8,&local_34);
            if ((!bVar3) || (RStack_1e8.recursion_depth_ == 0x100)) goto LAB_00269963;
            uVar9 = RStack_1e8.recursion_depth_ + 1;
            RVar7 = kImplPathEnding;
          }
          else {
            if (bVar1 != 0x4e) break;
            RStack_1e8.pos_ = RStack_1e8.pos_ + 2;
            if (0x19 < (byte)(RStack_1e8.encoding_[lVar4] + 0xbfU)) {
              if (((byte)(RStack_1e8.encoding_[lVar4] + 0x9fU) < 0x1a) &&
                 (RStack_1e8.recursion_depth_ != 0x100)) {
                uVar9 = RStack_1e8.recursion_depth_ + 1;
                RVar7 = kIdentifierInLowercaseNamespace;
                goto LAB_00268b8d;
              }
              goto LAB_00269963;
            }
            lVar10 = (long)RStack_1e8.namespace_depth_;
            if (lVar10 == 0x40) goto LAB_00269963;
            RStack_1e8.namespace_depth_ = RStack_1e8.namespace_depth_ + 1;
            RStack_1e8.namespace_stack_[lVar10] = RStack_1e8.encoding_[lVar4];
            if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_00269963;
            uVar9 = RStack_1e8.recursion_depth_ + 1;
            RVar7 = kIdentifierInUppercaseNamespace;
          }
        }
LAB_00268b8d:
        lVar4 = (long)RStack_1e8.recursion_depth_;
        RStack_1e8.recursion_depth_ = uVar9;
        RStack_1e8.recursion_stack_[lVar4] = RVar7;
      } while( true );
    }
  }
  else {
LAB_00269963:
    bVar12 = 0;
  }
LAB_00269966:
  return (bool)(bVar12 & 1);
switchD_00268e58_caseD_15:
  if (RStack_1e8.encoding_[RStack_1e8.pos_] != 'E') {
    if (RStack_1e8.silence_depth_ < 1) {
      if ((ulong)((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_) < 4) goto LAB_00269963;
      builtin_strncpy(RStack_1e8.out_," + ",4);
      RStack_1e8.out_ = RStack_1e8.out_ + 3;
    }
    RVar7 = kContinueAutoTraits;
    goto LAB_00269798;
  }
LAB_0026956b:
  RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
  bVar3 = anon_unknown_0::RustSymbolParser::ParseRequiredLifetime(&RStack_1e8);
  if (!bVar3) goto LAB_00269963;
  goto LAB_00268e17;
}

Assistant:

bool DemangleRustSymbolEncoding(const char* mangled, char* out,
                                size_t out_size) {
  return RustSymbolParser(mangled, out, out + out_size).Parse();
}